

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::fractional_part(spec *s)

{
  sequence *in_RDI;
  spec *in_stack_00000078;
  char_type in_stack_ffffffffffffff9f;
  sequence *this;
  sequence *in_stack_ffffffffffffffb0;
  character *in_stack_ffffffffffffffb8;
  sequence *in_stack_ffffffffffffffc0;
  
  this = in_RDI;
  character::character((character *)in_RDI,in_stack_ffffffffffffff9f);
  zero_prefixable_int(in_stack_00000078);
  sequence::sequence<toml::detail::character,toml::detail::sequence>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  sequence::~sequence(this);
  character::~character((character *)0x6ec855);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence fractional_part(const spec& s)
{
    return sequence(
            character('.'),
            zero_prefixable_int(s)
        );
}